

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void nni_stat_set_bool(nni_stat_item *item,_Bool b)

{
  _Bool b_local;
  nni_stat_item *item_local;
  
  (item->si_u).sv_bool = b;
  return;
}

Assistant:

void
nni_stat_set_bool(nni_stat_item *item, bool b)
{
#ifdef NNG_ENABLE_STATS
	// bool is atomic by definitions.
	item->si_u.sv_bool = b;
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(b);
#endif
}